

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adlibemu_opl_inc.c
# Opt level: O2

void disable_operator(op_type_conflict *op_pt,Bit32u act_type)

{
  uint uVar1;
  
  if (((op_pt->act_state != 0) &&
      (uVar1 = op_pt->act_state & ~act_type, op_pt->act_state = uVar1, uVar1 == 0)) &&
     (op_pt->op_state != 5)) {
    op_pt->op_state = 2;
    return;
  }
  return;
}

Assistant:

static void disable_operator(op_type* op_pt, Bit32u act_type)
{
	// check if this is really an on-off transition
	if (op_pt->act_state != OP_ACT_OFF)
	{
		op_pt->act_state &= (~act_type);
		if (op_pt->act_state == OP_ACT_OFF)
		{
			if (op_pt->op_state != OF_TYPE_OFF)
				op_pt->op_state = OF_TYPE_REL;
		}
	}
}